

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O0

QRect __thiscall QWidgetPrivate::effectiveRectFor(QWidgetPrivate *this,QRect *rect)

{
  bool bVar1;
  QRect *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QGraphicsEffect *in_stack_ffffffffffffff80;
  QRect *r;
  undefined1 local_58 [32];
  undefined1 local_38 [32];
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[6].yp == 0.0) ||
     (bVar1 = QGraphicsEffect::isEnabled(in_stack_ffffffffffffff80), !bVar1)) {
    local_18 = *in_RSI;
  }
  else {
    r = (QRect *)in_RDI[6].yp;
    QRectF::QRectF(in_RDI,r);
    (**(code **)(*(long *)r + 0x60))(local_38,r,local_58);
    local_18 = (QRect)QRectF::toAlignedRect();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

inline QRect effectiveRectFor(const QRect &rect) const
    {
#if QT_CONFIG(graphicseffect)
        if (graphicsEffect && graphicsEffect->isEnabled())
            return graphicsEffect->boundingRectFor(rect).toAlignedRect();
#endif // QT_CONFIG(graphicseffect)
        return rect;
    }